

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O2

int rsa_decrypt_wrap(mbedtls_pk_context *pk,uchar *input,size_t ilen,uchar *output,size_t *olen,
                    size_t osize,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_rsa_context *ctx;
  int iVar1;
  size_t sVar2;
  
  ctx = (mbedtls_rsa_context *)pk->pk_ctx;
  sVar2 = mbedtls_rsa_get_len(ctx);
  if (sVar2 == ilen) {
    iVar1 = mbedtls_rsa_pkcs1_decrypt(ctx,f_rng,p_rng,olen,input,output,osize);
  }
  else {
    iVar1 = -0x4080;
  }
  return iVar1;
}

Assistant:

static int rsa_decrypt_wrap(mbedtls_pk_context *pk,
                            const unsigned char *input, size_t ilen,
                            unsigned char *output, size_t *olen, size_t osize,
                            int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;

    if (ilen != mbedtls_rsa_get_len(rsa)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    return mbedtls_rsa_pkcs1_decrypt(rsa, f_rng, p_rng,
                                     olen, input, output, osize);
}